

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  int iVar1;
  FKey *pH;
  char *pTo_00;
  FKey *pFVar2;
  int *in_RCX;
  undefined8 *in_RDX;
  int *in_RSI;
  Parse *in_RDI;
  undefined4 in_R8D;
  int n;
  int j;
  int iCol;
  char *z;
  int nCol;
  int i;
  i64 nByte;
  Table *p;
  FKey *pNextTo;
  FKey *pFKey;
  sqlite3 *db;
  ExprList *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int iVar3;
  int in_stack_ffffffffffffff9c;
  Parse *pParse_00;
  int local_58;
  int local_54;
  Table *data;
  char *pKey;
  
  pKey = &DAT_aaaaaaaaaaaaaaaa;
  data = in_RDI->pNewTable;
  if ((data == (Table *)0x0) || (in_RDI->eParseMode == '\x01')) goto LAB_001b0ffb;
  if (in_RSI == (int *)0x0) {
    in_stack_ffffffffffffff9c = data->nCol + -1;
    if (in_stack_ffffffffffffff9c < 0) goto LAB_001b0ffb;
    if ((in_RCX != (int *)0x0) && (*in_RCX != 1)) {
      sqlite3ErrorMsg(in_RDI,"foreign key on %s should reference only one column of table %T",
                      data->aCol[in_stack_ffffffffffffff9c].zCnName,in_RDX);
      goto LAB_001b0ffb;
    }
    local_58 = 1;
  }
  else {
    if ((in_RCX != (int *)0x0) && (*in_RCX != *in_RSI)) {
      sqlite3ErrorMsg(in_RDI,
                      "number of columns in foreign key does not match the number of columns in the referenced table"
                     );
      goto LAB_001b0ffb;
    }
    local_58 = *in_RSI;
  }
  if (in_RCX != (int *)0x0) {
    for (local_54 = 0; local_54 < *in_RCX; local_54 = local_54 + 1) {
      sqlite3Strlen30((char *)in_stack_ffffffffffffff88);
    }
  }
  pH = (FKey *)sqlite3DbMallocZero((sqlite3 *)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   (u64)in_stack_ffffffffffffff88);
  if (pH != (FKey *)0x0) {
    pH->pFrom = data;
    pH->pNextFrom = (data->u).tab.pFKey;
    pParse_00 = (Parse *)(pH->aCol + local_58);
    pH->zTo = (char *)pParse_00;
    if (1 < in_RDI->eParseMode) {
      sqlite3RenameTokenMap
                (pParse_00,(void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (Token *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    memcpy(pParse_00,(void *)*in_RDX,(ulong)*(uint *)(in_RDX + 1));
    *(undefined1 *)((long)&pParse_00->db + (ulong)*(uint *)(in_RDX + 1)) = 0;
    sqlite3Dequote((char *)pParse_00);
    pTo_00 = (char *)((long)&pParse_00->db + (ulong)(*(int *)(in_RDX + 1) + 1));
    pH->nCol = local_58;
    if (in_RSI == (int *)0x0) {
      pH->aCol[0].iFrom = data->nCol + -1;
    }
    else {
      for (local_54 = 0; local_54 < local_58; local_54 = local_54 + 1) {
        for (iVar3 = 0; iVar3 < data->nCol; iVar3 = iVar3 + 1) {
          iVar1 = sqlite3StrICmp(data->aCol[iVar3].zCnName,
                                 *(char **)(in_RSI + (long)local_54 * 6 + 4));
          if (iVar1 == 0) {
            pH->aCol[local_54].iFrom = iVar3;
            break;
          }
        }
        if (data->nCol <= iVar3) {
          sqlite3ErrorMsg(in_RDI,"unknown column \"%s\" in foreign key definition",
                          *(undefined8 *)(in_RSI + (long)local_54 * 6 + 4));
          goto LAB_001b0ffb;
        }
        if (1 < in_RDI->eParseMode) {
          sqlite3RenameTokenRemap
                    (in_RDI,pH->aCol + local_54,*(void **)(in_RSI + (long)local_54 * 6 + 4));
        }
      }
    }
    if (in_RCX != (int *)0x0) {
      for (local_54 = 0; local_54 < local_58; local_54 = local_54 + 1) {
        in_stack_ffffffffffffff94 = sqlite3Strlen30((char *)in_stack_ffffffffffffff88);
        pH->aCol[local_54].zCol = pTo_00;
        if (1 < in_RDI->eParseMode) {
          sqlite3RenameTokenRemap(in_RDI,pTo_00,*(void **)(in_RCX + (long)local_54 * 6 + 4));
        }
        memcpy(pTo_00,*(void **)(in_RCX + (long)local_54 * 6 + 4),(long)in_stack_ffffffffffffff94);
        pTo_00[in_stack_ffffffffffffff94] = '\0';
        pTo_00 = pTo_00 + (in_stack_ffffffffffffff94 + 1);
      }
    }
    pH->isDeferred = '\0';
    pH->aAction[0] = (u8)in_R8D;
    pH->aAction[1] = (u8)((uint)in_R8D >> 8);
    pFVar2 = (FKey *)sqlite3HashInsert((Hash *)pH,pKey,data);
    if (pFVar2 == pH) {
      sqlite3OomFault((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    else {
      if (pFVar2 != (FKey *)0x0) {
        pH->pNextTo = pFVar2;
        pFVar2->pPrevTo = pH;
      }
      (data->u).tab.pFKey = pH;
    }
  }
LAB_001b0ffb:
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff88);
  sqlite3ExprListDelete
            ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  sqlite3ExprListDelete
            ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  i64 nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zCnName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zEName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  assert( IsOrdinaryTable(p) );
  pFKey->pNextFrom = p->u.tab.pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenMap(pParse, (void*)z, pTo);
  }
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zCnName, pFromCol->a[i].zEName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse,
          "unknown column \"%s\" in foreign key definition",
          pFromCol->a[i].zEName);
        goto fk_end;
      }
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, &pFKey->aCol[i], pFromCol->a[i].zEName);
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zEName);
      pFKey->aCol[i].zCol = z;
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, z, pToCol->a[i].zEName);
      }
      memcpy(z, pToCol->a[i].zEName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash,
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    sqlite3OomFault(db);
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  assert( IsOrdinaryTable(p) );
  p->u.tab.pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}